

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int do_gotoeop(int f,int n,int *i)

{
  bool bVar1;
  ushort **ppuVar2;
  int iVar3;
  bool bVar4;
  int local_2c;
  int j;
  int nospace;
  int col;
  int *i_local;
  int n_local;
  int f_local;
  
  local_2c = 0;
  i_local._4_4_ = n;
  if (n < 0) {
    n_local = gotobop(f,-n);
  }
  else {
LAB_0011aa86:
    iVar3 = i_local._4_4_ + -1;
    if (0 < i_local._4_4_) {
      local_2c = local_2c + 1;
      *i = local_2c;
      bVar1 = false;
      while (i_local._4_4_ = iVar3, curwp->w_dotp->l_fp != curbp->b_headp) {
        j = 0;
        curwp->w_doto = 0;
        while( true ) {
          bVar4 = false;
          if (j < curwp->w_dotp->l_used) {
            ppuVar2 = __ctype_b_loc();
            bVar4 = ((*ppuVar2)[(int)(uint)(byte)curwp->w_dotp->l_text[j]] & 0x2000) != 0;
          }
          if (!bVar4) break;
          j = j + 1;
        }
        if (j < curwp->w_dotp->l_used) {
          bVar1 = true;
        }
        else if (bVar1) break;
        curwp->w_dotp = curwp->w_dotp->l_fp;
        curwp->w_dotline = curwp->w_dotline + 1;
      }
      goto LAB_0011aa86;
    }
    if (curwp->w_dotp->l_fp == curbp->b_headp) {
      gotoeol(8,1);
      curwp->w_rflag = curwp->w_rflag | 2;
      n_local = 0;
    }
    else {
      curwp->w_rflag = curwp->w_rflag | 2;
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
do_gotoeop(int f, int n, int *i)
{
	int col, nospace, j = 0;

	/* the other way... */
	if (n < 0)
		return (gotobop(f, -n));

	/* for each one asked for */
	while (n-- > 0) {
		*i = ++j;
		nospace = 0;
		while (lforw(curwp->w_dotp) != curbp->b_headp) {
			col = 0;
			curwp->w_doto = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotp = lforw(curwp->w_dotp);
			curwp->w_dotline++;

		}
	}
	/* do not continue after end of buffer */
	if (lforw(curwp->w_dotp) == curbp->b_headp) {
		gotoeol(FFRAND, 1);
		curwp->w_rflag |= WFMOVE;
		return (FALSE);
	}

	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}